

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleShadingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleShadingStateCase::iterate
          (SampleShadingStateCase *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  MessageBuilder local_3b0;
  MessageBuilder local_230;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  SampleShadingStateCase *this_local;
  
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8," // ERROR: ",&local_a9);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar3,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_230,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_230,(char (*) [24])"Verifying initial value");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_230);
  deqp::gls::StateQueryUtil::verifyStateBoolean
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x8c36,false,this->m_verifier);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_3b0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_3b0,(char (*) [24])"Verifying random values");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3b0);
  glu::CallLogWrapper::glEnable((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8c36);
  deqp::gls::StateQueryUtil::verifyStateBoolean
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x8c36,true,this->m_verifier);
  glu::CallLogWrapper::glDisable((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8c36);
  deqp::gls::StateQueryUtil::verifyStateBoolean
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x8c36,false,this->m_verifier);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

SampleShadingStateCase::IterateResult SampleShadingStateCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	gl.enableLogging(true);

	// initial
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying initial value" << tcu::TestLog::EndMessage;
		verifyStateBoolean(result, gl, GL_SAMPLE_SHADING, false, m_verifier);
	}

	// true and false too
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying random values" << tcu::TestLog::EndMessage;

		gl.glEnable(GL_SAMPLE_SHADING);
		verifyStateBoolean(result, gl, GL_SAMPLE_SHADING, true, m_verifier);

		gl.glDisable(GL_SAMPLE_SHADING);
		verifyStateBoolean(result, gl, GL_SAMPLE_SHADING, false, m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}